

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineSegmentedPath.cpp
# Opt level: O0

void __thiscall
OpenSteer::PolylineSegmentedPath::PolylineSegmentedPath
          (PolylineSegmentedPath *this,size_type numOfPoints,Vec3 *newPoints,bool closedCycle)

{
  byte in_CL;
  undefined8 *in_RDI;
  SegmentedPath *in_stack_ffffffffffffffa0;
  undefined1 closedCycle_00;
  allocator_type *in_stack_ffffffffffffffb0;
  Vec3 *newPoints_00;
  PolylineSegmentedPath *this_00;
  Vec3 local_2d;
  byte local_19;
  
  local_19 = in_CL & 1;
  SegmentedPath::SegmentedPath(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__PolylineSegmentedPath_001c2af8;
  this_00 = (PolylineSegmentedPath *)(in_RDI + 1);
  std::allocator<OpenSteer::Vec3>::allocator((allocator<OpenSteer::Vec3> *)0x165f51);
  std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::vector
            ((vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_> *)this_00,(size_type)in_RDI,
             in_stack_ffffffffffffffb0);
  std::allocator<OpenSteer::Vec3>::~allocator((allocator<OpenSteer::Vec3> *)0x165f70);
  closedCycle_00 = (undefined1)((ulong)(in_RDI + 4) >> 0x38);
  newPoints_00 = &local_2d;
  std::allocator<OpenSteer::Vec3>::allocator((allocator<OpenSteer::Vec3> *)0x165f8d);
  std::vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>::vector
            ((vector<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_> *)this_00,(size_type)in_RDI,
             (allocator_type *)newPoints_00);
  std::allocator<OpenSteer::Vec3>::~allocator((allocator<OpenSteer::Vec3> *)0x165fac);
  std::allocator<float>::allocator((allocator<float> *)0x165fc8);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)this_00,(size_type)in_RDI,
             (allocator_type *)newPoints_00);
  std::allocator<float>::~allocator((allocator<float> *)0x165fe6);
  *(byte *)(in_RDI + 10) = local_19 & 1;
  setPath(this_00,(size_type)in_RDI,newPoints_00,(bool)closedCycle_00);
  return;
}

Assistant:

OpenSteer::PolylineSegmentedPath::PolylineSegmentedPath( size_type numOfPoints,
                                                         Vec3 const newPoints[],
                                                         bool closedCycle )
    : points_( 0 ), segmentTangents_( 0 ), segmentLengths_( 0 ), closedCycle_( closedCycle )
{
        setPath( numOfPoints, newPoints, closedCycle );
}